

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

void anon_unknown.dwarf_1ded3::setupTable
               (FunctionTableHolder *oldTable,FunctionTableHolder *newTable,bool forceSetup)

{
  bool forceSetup_00;
  byte in_DL;
  _func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
  **in_RSI;
  _func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
  **in_RDI;
  
  forceSetup_00 = (bool)(in_DL & 1);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_RDI,in_RSI,forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              **)(in_RDI + 1),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              **)(in_RSI + 1),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_RDI + 2,in_RSI + 2,forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_RDI + 3,in_RSI + 3,forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_RDI + 4,in_RSI + 4,forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 5),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 5),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 6),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 6),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 7),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 7),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar
              **)(in_RDI + 8),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar
              **)(in_RSI + 8),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar **)(in_RDI + 9),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar **)(in_RSI + 9),
             forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,bool,bool)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_bool_bool
              **)(in_RDI + 10),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_bool_bool
              **)(in_RSI + 10),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,double,double)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_double_double
              **)(in_RDI + 0xb),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_double_double
              **)(in_RSI + 0xb),forceSetup_00);
  (anonymous_namespace)::
  setFunction<unsigned_char(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int)>
            ((_func_uchar_ImageTemplate<unsigned_char>_ptr_uint_uint **)(in_RDI + 0xc),
             (_func_uchar_ImageTemplate<unsigned_char>_ptr_uint_uint **)(in_RSI + 0xc),forceSetup_00
            );
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              **)(in_RDI + 0xd),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              **)(in_RSI + 0xd),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0xe),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0xe),forceSetup_00);
  (anonymous_namespace)::
  setFunction<bool(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_bool_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0xf),
             (_func_bool_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0xf),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_char,_std::allocator<unsigned_char>_>_ptr
              **)(in_RDI + 0x10),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_char,_std::allocator<unsigned_char>_>_ptr
              **)(in_RSI + 0x10),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_RDI + 0x11,in_RSI + 0x11,forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0x12),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0x12),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_RDI + 0x13,in_RSI + 0x13,forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0x14),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0x14),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,bool,std::vector<unsigned_int,std::allocator<unsigned_int>>&)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_bool_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              **)(in_RDI + 0x15),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_bool_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              **)(in_RSI + 0x15),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0x16),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0x16),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0x17),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0x17),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uchar **)(in_RDI + 0x18),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uchar **)(in_RSI + 0x18),
             forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr_uchar
              **)(in_RDI + 0x19),
             (_func_void_ImageTemplate<unsigned_char>_ptr_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr_uchar
              **)(in_RSI + 0x19),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0x1b),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0x1b),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_RDI + 0x1c,in_RSI + 0x1c,forceSetup_00);
  (anonymous_namespace)::
  setFunction<unsigned_int(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint **)(in_RDI + 0x1d),
             (_func_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint **)(in_RSI + 0x1d),
             forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar
              **)(in_RDI + 0x1e),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar
              **)(in_RSI + 0x1e),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar_uchar
              **)(in_RDI + 0x1f),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar_uchar
              **)(in_RSI + 0x1f),forceSetup_00);
  (anonymous_namespace)::
  setFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RDI + 0x20),
             (_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              **)(in_RSI + 0x20),forceSetup_00);
  return;
}

Assistant:

void setupTable( Image_Function_Helper::FunctionTableHolder & oldTable, const Image_Function_Helper::FunctionTableHolder & newTable, bool forceSetup )
    {
        SET_FUNCTION(AbsoluteDifference)
        SET_FUNCTION(Accumulate)
        SET_FUNCTION(BitwiseAnd)
        SET_FUNCTION(BitwiseOr)
        SET_FUNCTION(BitwiseXor)
        SET_FUNCTION(ConvertToGrayScale)
        SET_FUNCTION(ConvertToRgb)
        SET_FUNCTION(Copy)
        SET_FUNCTION(ExtractChannel)
        SET_FUNCTION(Fill)
        SET_FUNCTION(Flip)
        SET_FUNCTION(GammaCorrection)
        SET_FUNCTION(GetPixel)
        SET_FUNCTION(Histogram)
        SET_FUNCTION(Invert)
        SET_FUNCTION(IsEqual)
        SET_FUNCTION(LookupTable)
        SET_FUNCTION(Maximum)
        SET_FUNCTION(Merge)
        SET_FUNCTION(Minimum)
        SET_FUNCTION(Normalize)
        SET_FUNCTION(ProjectionProfile)
        SET_FUNCTION(Resize)
        SET_FUNCTION(RgbToBgr)
        SET_FUNCTION(SetPixel)
        SET_FUNCTION(SetPixel2)
        SET_FUNCTION(Split)
        SET_FUNCTION(Subtract)
        SET_FUNCTION(Sum)
        SET_FUNCTION(Threshold)
        SET_FUNCTION(Threshold2)
        SET_FUNCTION(Transpose)
    }